

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int nextScaffoldPart(XML_Parser parser)

{
  long lVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  
  if (*(long *)((long)parser + 0x3c0) == 0) {
    puVar4 = (undefined4 *)
             (**(code **)((long)parser + 0x18))((ulong)*(uint *)((long)parser + 0x480) << 2);
    *(undefined4 **)((long)parser + 0x3c0) = puVar4;
    if (puVar4 == (undefined4 *)0x0) {
      return -1;
    }
    *puVar4 = 0;
  }
  uVar3 = *(uint *)((long)parser + 0x3b8);
  lVar5 = *(long *)((long)parser + 0x3a8);
  if (*(uint *)((long)parser + 0x3b4) <= uVar3) {
    if (lVar5 == 0) {
      *(undefined4 *)((long)parser + 0x3b4) = 0x20;
      lVar5 = (**(code **)((long)parser + 0x18))(0x400);
    }
    else {
      uVar3 = *(uint *)((long)parser + 0x3b4) * 2;
      *(uint *)((long)parser + 0x3b4) = uVar3;
      lVar5 = (**(code **)((long)parser + 0x20))(lVar5,(ulong)uVar3 << 5);
    }
    *(long *)((long)parser + 0x3a8) = lVar5;
    if (lVar5 == 0) {
      return -1;
    }
    uVar3 = *(uint *)((long)parser + 0x3b8);
  }
  *(uint *)((long)parser + 0x3b8) = uVar3 + 1;
  if ((long)*(int *)((long)parser + 0x3bc) != 0) {
    lVar6 = (long)*(int *)(*(long *)((long)parser + 0x3c0) + -4 +
                          (long)*(int *)((long)parser + 0x3bc) * 4) * 0x20;
    lVar1 = lVar5 + lVar6;
    lVar6 = (long)*(int *)(lVar5 + 0x14 + lVar6);
    if (lVar6 != 0) {
      *(uint *)(lVar5 + 0x1c + lVar6 * 0x20) = uVar3;
    }
    if (*(int *)(lVar1 + 0x18) == 0) {
      *(uint *)(lVar1 + 0x10) = uVar3;
    }
    *(uint *)(lVar1 + 0x14) = uVar3;
    *(int *)(lVar1 + 0x18) = *(int *)(lVar1 + 0x18) + 1;
  }
  puVar2 = (undefined8 *)(lVar5 + 0x10 + (long)(int)uVar3 * 0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  return uVar3;
}

Assistant:

static int
nextScaffoldPart(XML_Parser parser)
{
  CONTENT_SCAFFOLD * me;
  int next;

  if (! dtd.scaffIndex) {
    dtd.scaffIndex = MALLOC(groupSize * sizeof(int));
    if (! dtd.scaffIndex)
      return -1;
    dtd.scaffIndex[0] = 0;
  }

  if (dtd.scaffCount >= dtd.scaffSize) {
    if (dtd.scaffold) {
      dtd.scaffSize *= 2;
      dtd.scaffold = (CONTENT_SCAFFOLD *) REALLOC(dtd.scaffold,
                                              dtd.scaffSize * sizeof(CONTENT_SCAFFOLD));
    }
    else {
      dtd.scaffSize = 32;
      dtd.scaffold = (CONTENT_SCAFFOLD *) MALLOC(dtd.scaffSize * sizeof(CONTENT_SCAFFOLD));
    }
    if (! dtd.scaffold)
      return -1;
  }
  next = dtd.scaffCount++;
  me = &dtd.scaffold[next];
  if (dtd.scaffLevel) { 
    CONTENT_SCAFFOLD *parent = &dtd.scaffold[dtd.scaffIndex[dtd.scaffLevel - 1]];
    if (parent->lastchild) {
      dtd.scaffold[parent->lastchild].nextsib = next;
    }
    if (! parent->childcnt)
      parent->firstchild = next;
    parent->lastchild = next;
    parent->childcnt++;
  }
  me->firstchild = me->lastchild = me->childcnt = me->nextsib = 0;
  return next;
}